

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wrapper.cpp
# Opt level: O0

UniquePtr<SDL_Surface> * __thiscall
solitaire::SDL::Wrapper::loadBMP
          (UniquePtr<SDL_Surface> *__return_storage_ptr__,Wrapper *this,string *file)

{
  undefined8 uVar1;
  pointer __p;
  PtrDeleter local_41;
  function<void_(SDL_Surface_*)> local_40;
  string *local_20;
  string *file_local;
  Wrapper *this_local;
  
  local_20 = file;
  file_local = (string *)this;
  this_local = (Wrapper *)__return_storage_ptr__;
  uVar1 = std::__cxx11::string::c_str();
  uVar1 = SDL_RWFromFile(uVar1,"rb");
  __p = (pointer)SDL_LoadBMP_RW(uVar1,1);
  std::function<void(SDL_Surface*)>::function<solitaire::SDL::PtrDeleter,void>
            ((function<void(SDL_Surface*)> *)&local_40,&local_41);
  std::unique_ptr<SDL_Surface,std::function<void(SDL_Surface*)>>::
  unique_ptr<std::function<void(SDL_Surface*)>,void>
            ((unique_ptr<SDL_Surface,std::function<void(SDL_Surface*)>> *)__return_storage_ptr__,__p
             ,&local_40);
  std::function<void_(SDL_Surface_*)>::~function(&local_40);
  return __return_storage_ptr__;
}

Assistant:

UniquePtr<SDL_Surface> Wrapper::loadBMP(const std::string& file) const {
    return UniquePtr<SDL_Surface> {SDL_LoadBMP(file.c_str()), PtrDeleter {}};
}